

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_HTMLparser(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  htmlDocPtr pxVar40;
  long lVar41;
  htmlParserCtxtPtr pxVar42;
  xmlDocPtr pxVar43;
  ulong uVar44;
  xmlParserCtxtPtr pxVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  int n_options;
  uint uVar48;
  undefined4 *puVar49;
  ulong *puVar50;
  undefined8 *puVar51;
  ulong uVar52;
  int n_legacy;
  uint uVar53;
  int *piVar54;
  undefined *puVar55;
  int test_ret_11;
  ulong uVar56;
  int test_ret_2;
  int iVar57;
  char *pcVar58;
  undefined8 uVar59;
  int *piVar60;
  uint *puVar61;
  int n_name;
  uint uVar62;
  undefined4 uVar63;
  int test_ret;
  int test_ret_23;
  int test_ret_5;
  int test_ret_1;
  int test_ret_18;
  int test_ret_6;
  int test_ret_3;
  undefined8 local_80;
  undefined8 local_78;
  int local_64;
  int local_44;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  iVar7 = 0;
  uVar62 = 0;
  do {
    puVar49 = &DAT_00158164;
    uVar56 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar52 = (&DAT_0015ad60)[uVar62];
      }
      else {
        uVar52 = 0;
      }
      htmlAttrAllowed(0,uVar52,*puVar49);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      iVar6 = (int)uVar56;
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar5 - iVar4));
        iVar7 = iVar7 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
        uVar52 = uVar56;
      }
      uVar53 = iVar6 + 1;
      uVar56 = (ulong)uVar53;
      puVar49 = puVar49 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar62 = 0;
  do {
    puVar50 = &DAT_0015ad60;
    uVar53 = 0;
    do {
      iVar5 = (int)uVar52;
      iVar4 = xmlMemBlocks();
      pxVar40 = gen_htmlDocPtr(uVar62,iVar5);
      if (uVar53 < 4) {
        uVar52 = *puVar50;
      }
      else {
        uVar52 = 0;
      }
      htmlAutoCloseTag(pxVar40,uVar52,0);
      call_tests = call_tests + 1;
      if (((pxVar40 != (htmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar5 - iVar4));
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        uVar52 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar53 = uVar53 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar53 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar62 = 0;
  do {
    puVar51 = &DAT_0015ad48;
    uVar53 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar62 < 5) {
        puVar55 = (&PTR_anon_var_dwarf_674_0015ad20)[uVar62];
      }
      else {
        puVar55 = (undefined *)0x0;
      }
      if (uVar53 < 3) {
        uVar59 = *puVar51;
      }
      else {
        uVar59 = 0;
      }
      lVar41 = htmlCreateFileParserCtxt(puVar55,uVar59);
      if (lVar41 != 0) {
        htmlFreeParserCtxt();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
      }
      uVar53 = uVar53 + 1;
      puVar51 = puVar51 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 6);
  function_tests = function_tests + 1;
  iVar7 = local_64 + iVar7;
  uVar62 = 0;
  iVar5 = 0;
  do {
    piVar60 = &DAT_00158164;
    uVar53 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar62 == 0) {
        bVar1 = false;
        pcVar58 = "foo";
      }
      else if (uVar62 == 2) {
        bVar1 = false;
        pcVar58 = "test/ent2";
      }
      else if (uVar62 == 1) {
        bVar1 = false;
        pcVar58 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar58 = (char *)0x0;
      }
      iVar9 = *piVar60;
      if ((!bVar1) && (iVar8 = xmlStrlen(pcVar58), iVar8 < iVar9)) {
        iVar9 = 0;
      }
      lVar41 = htmlCreateMemoryParserCtxt(pcVar58,iVar9);
      if (lVar41 != 0) {
        htmlFreeParserCtxt(lVar41);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar6 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar9 - iVar6))
        ;
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d",(ulong)uVar53);
        putchar(10);
      }
      uVar53 = uVar53 + 1;
      piVar60 = piVar60 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  iVar9 = 0;
  do {
    iVar8 = 0;
    do {
      uVar62 = 0;
      do {
        uVar56 = 0;
        do {
          piVar60 = (int *)0x0;
          puVar49 = &DAT_0014c234;
          do {
            iVar10 = xmlMemBlocks();
            piVar54 = &call_tests;
            if (iVar9 != 0) {
              if (iVar9 == 1) {
                piVar54 = (int *)0xffffffffffffffff;
              }
              else {
                piVar54 = (int *)0x0;
              }
            }
            if (iVar8 == 0) {
              bVar1 = false;
              pcVar58 = "foo";
            }
            else if (iVar8 == 2) {
              bVar1 = false;
              pcVar58 = "test/ent2";
            }
            else if (iVar8 == 1) {
              bVar1 = false;
              pcVar58 = "<foo/>";
            }
            else {
              bVar1 = true;
              pcVar58 = (char *)0x0;
            }
            iVar12 = -1;
            if (uVar62 < 4) {
              iVar12 = (&DAT_00158164)[uVar62];
            }
            if ((uint)uVar56 < 5) {
              puVar55 = (&PTR_anon_var_dwarf_674_0015ad20)[uVar56];
            }
            else {
              puVar55 = (undefined *)0x0;
            }
            uVar63 = 0xffffffff;
            uVar53 = (uint)piVar60;
            if (uVar53 < 3) {
              uVar63 = *puVar49;
            }
            if ((!bVar1) && (iVar11 = xmlStrlen(pcVar58), iVar11 < iVar12)) {
              iVar12 = 0;
            }
            lVar41 = htmlCreatePushParserCtxt(0,piVar54,pcVar58,iVar12,puVar55,uVar63);
            if (lVar41 != 0) {
              htmlFreeParserCtxt(lVar41);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar12 = xmlMemBlocks();
            pcVar58 = (char *)piVar54;
            if (iVar10 != iVar12) {
              iVar12 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                     (ulong)(uint)(iVar12 - iVar10));
              iVar6 = iVar6 + 1;
              printf(" %d",0);
              printf(" %d",iVar9);
              printf(" %d",iVar8);
              printf(" %d",(ulong)uVar62);
              printf(" %d",uVar56);
              printf(" %d");
              putchar(10);
              pcVar58 = (char *)piVar60;
            }
            uVar53 = uVar53 + 1;
            piVar60 = (int *)(ulong)uVar53;
            puVar49 = puVar49 + 1;
          } while (uVar53 != 4);
          uVar53 = (uint)uVar56 + 1;
          uVar56 = (ulong)uVar53;
        } while (uVar53 != 6);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 4);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  iVar9 = 0;
  do {
    iVar12 = (int)pcVar58;
    iVar10 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(iVar9,iVar12);
    pcVar58 = (char *)0x0;
    pxVar43 = (xmlDocPtr)htmlCtxtParseDocument(pxVar42);
    if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
      xmlFreeDoc(pxVar43);
    }
    call_tests = call_tests + 1;
    if (pxVar42 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar10 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar12 - iVar10));
      iVar8 = iVar8 + 1;
      printf(" %d");
      pcVar58 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_0015ad60;
  iVar9 = 0;
  uVar62 = 0;
  do {
    uVar53 = 0;
    do {
      uVar56 = 0;
      do {
        uVar52 = 0;
        do {
          piVar60 = (int *)0x0;
          puVar49 = &DAT_00158164;
          do {
            iVar12 = (int)pcVar58;
            iVar10 = xmlMemBlocks();
            pxVar42 = gen_htmlParserCtxtPtr(uVar62,iVar12);
            if (uVar53 < 4) {
              pcVar58 = (char *)(&DAT_0015ad60)[uVar53];
            }
            else {
              pcVar58 = (char *)0x0;
            }
            if ((uint)uVar56 < 3) {
              uVar59 = (&DAT_0015ad48)[uVar56];
            }
            else {
              uVar59 = 0;
            }
            if ((uint)uVar52 < 3) {
              uVar46 = (&DAT_0015ad48)[uVar52];
            }
            else {
              uVar46 = 0;
            }
            pxVar43 = (xmlDocPtr)htmlCtxtReadDoc(pxVar42,pcVar58,uVar59,uVar46,*puVar49);
            if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc))
            {
              xmlFreeDoc(pxVar43);
            }
            call_tests = call_tests + 1;
            if (pxVar42 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar42);
            }
            xmlResetLastError();
            iVar12 = xmlMemBlocks();
            iVar11 = (int)piVar60;
            if (iVar10 != iVar12) {
              iVar12 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar12 - iVar10));
              iVar9 = iVar9 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar53);
              printf(" %d",uVar56);
              printf(" %d",uVar52);
              printf(" %d");
              putchar(10);
              pcVar58 = (char *)piVar60;
            }
            uVar48 = iVar11 + 1;
            piVar60 = (int *)(ulong)uVar48;
            puVar49 = puVar49 + 1;
          } while (uVar48 != 4);
          uVar48 = (uint)uVar52 + 1;
          uVar52 = (ulong)uVar48;
        } while (uVar48 != 4);
        uVar48 = (uint)uVar56 + 1;
        uVar56 = (ulong)uVar48;
      } while (uVar48 != 4);
      uVar53 = uVar53 + 1;
    } while (uVar53 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar10 = 0;
  do {
    uVar62 = 0;
    do {
      uVar56 = 0;
      do {
        lVar41 = 0;
        do {
          pxVar42 = gen_htmlParserCtxtPtr(iVar10,(int)pcVar58);
          if (uVar62 < 7) {
            pcVar58 = (char *)(&DAT_0015ad80)[uVar62];
          }
          else {
            pcVar58 = (char *)0x0;
          }
          if ((uint)uVar56 < 3) {
            uVar59 = (&DAT_0015ad48)[uVar56];
          }
          else {
            uVar59 = 0;
          }
          pxVar43 = (xmlDocPtr)
                    htmlCtxtReadFile(pxVar42,pcVar58,uVar59,
                                     *(undefined4 *)((long)&DAT_00158164 + lVar41));
          if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
            xmlFreeDoc(pxVar43);
          }
          call_tests = call_tests + 1;
          if (pxVar42 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar42);
          }
          xmlResetLastError();
          lVar41 = lVar41 + 4;
        } while ((int)lVar41 != 0x10);
        uVar53 = (uint)uVar56 + 1;
        uVar56 = (ulong)uVar53;
      } while (uVar53 != 4);
      uVar62 = uVar62 + 1;
    } while (uVar62 != 8);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar62 = 0;
  do {
    uVar53 = 0;
    do {
      uVar56 = 0;
      do {
        uVar52 = 0;
        do {
          uVar44 = 0;
          do {
            uVar48 = 0;
            do {
              iVar12 = (int)pcVar58;
              iVar10 = xmlMemBlocks();
              pxVar42 = gen_htmlParserCtxtPtr(uVar62,iVar12);
              if (uVar53 == 0) {
                pcVar58 = "foo";
LAB_00118191:
                bVar1 = false;
              }
              else {
                if (uVar53 == 2) {
                  pcVar58 = "test/ent2";
                  goto LAB_00118191;
                }
                if (uVar53 == 1) {
                  bVar1 = false;
                  pcVar58 = "<foo/>";
                }
                else {
                  bVar1 = true;
                  pcVar58 = (char *)0x0;
                }
              }
              iVar12 = -1;
              if ((uint)uVar56 < 4) {
                iVar12 = (&DAT_00158164)[uVar56];
              }
              if ((uint)uVar52 < 3) {
                uVar59 = (&DAT_0015ad48)[uVar52];
              }
              else {
                uVar59 = 0;
              }
              if ((!bVar1) && (iVar11 = xmlStrlen(pcVar58), iVar11 < iVar12)) {
                iVar12 = 0;
              }
              pxVar43 = (xmlDocPtr)htmlCtxtReadMemory(pxVar42,pcVar58,iVar12,uVar59);
              if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar43);
              }
              call_tests = call_tests + 1;
              if (pxVar42 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt(pxVar42);
              }
              xmlResetLastError();
              iVar12 = xmlMemBlocks();
              if (iVar10 != iVar12) {
                iVar12 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",
                       (ulong)(uint)(iVar12 - iVar10));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)uVar62);
                printf(" %d",(ulong)uVar53);
                printf(" %d",uVar56);
                printf(" %d",uVar52);
                printf(" %d",uVar44);
                pcVar58 = (char *)(ulong)uVar48;
                printf(" %d");
                putchar(10);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != 4);
            uVar48 = (int)uVar44 + 1;
            uVar44 = (ulong)uVar48;
          } while (uVar48 != 4);
          uVar48 = (uint)uVar52 + 1;
          uVar52 = (ulong)uVar48;
        } while (uVar48 != 4);
        uVar48 = (uint)uVar56 + 1;
        uVar56 = (ulong)uVar48;
      } while (uVar48 != 4);
      uVar53 = uVar53 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar10 = 0;
  do {
    iVar12 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(uVar62,(int)pcVar58);
    htmlCtxtReset(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar12 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar11 - iVar12));
      iVar10 = iVar10 + 1;
      pcVar58 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar62 = 0;
  do {
    puVar61 = &DAT_00158164;
    piVar60 = (int *)0x0;
    do {
      iVar13 = (int)pcVar58;
      iVar11 = xmlMemBlocks();
      pxVar45 = gen_xmlParserCtxtPtr(uVar62,iVar13);
      pcVar58 = (char *)(ulong)*puVar61;
      htmlCtxtSetOptions(pxVar45);
      call_tests = call_tests + 1;
      if (pxVar45 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar45);
      }
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      iVar14 = (int)piVar60;
      if (iVar11 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar13 - iVar11));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
        pcVar58 = (char *)piVar60;
      }
      uVar53 = iVar14 + 1;
      piVar60 = (int *)(ulong)uVar53;
      puVar61 = puVar61 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar62 = 0;
  do {
    puVar61 = &DAT_00158164;
    piVar60 = (int *)0x0;
    do {
      iVar14 = (int)pcVar58;
      iVar13 = xmlMemBlocks();
      pxVar42 = gen_htmlParserCtxtPtr(uVar62,iVar14);
      pcVar58 = (char *)(ulong)*puVar61;
      htmlCtxtUseOptions(pxVar42);
      call_tests = call_tests + 1;
      if (pxVar42 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar42);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      iVar15 = (int)piVar60;
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar14 - iVar13));
        iVar11 = iVar11 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
        pcVar58 = (char *)piVar60;
      }
      uVar53 = iVar15 + 1;
      piVar60 = (int *)(ulong)uVar53;
      puVar61 = puVar61 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar59 = *local_38;
    }
    else {
      uVar59 = 0;
    }
    htmlElementAllowedHere(0,uVar59);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    local_38 = local_38 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    iVar16 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar16 - iVar14));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = 0;
  local_78 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    local_80 = 0;
    uVar56 = 0;
    if (bVar3) {
      uVar56 = 0x15d404;
    }
    bVar1 = true;
    do {
      bVar2 = bVar1;
      uVar59 = 0;
      if (bVar2) {
        uVar59 = 0x15d40c;
      }
      puVar49 = &DAT_00158164;
      uVar52 = 0;
      do {
        iVar17 = xmlMemBlocks();
        uVar44 = uVar56;
        htmlEncodeEntities(0,uVar56,0,uVar59,*puVar49);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar18 = xmlMemBlocks();
        iVar19 = (int)uVar52;
        if (iVar17 != iVar18) {
          iVar18 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar18 - iVar17));
          iVar16 = iVar16 + 1;
          printf(" %d",0);
          printf(" %d",local_78);
          printf(" %d",0);
          printf(" %d",local_80);
          printf(" %d");
          putchar(10);
          uVar44 = uVar52;
        }
        uVar62 = iVar19 + 1;
        uVar52 = (ulong)uVar62;
        puVar49 = puVar49 + 1;
      } while (uVar62 != 4);
      local_80 = 1;
      bVar1 = false;
    } while (bVar2);
    local_78 = 1;
    bVar1 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  puVar51 = &DAT_0015ad60;
  uVar62 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar59 = *puVar51;
    }
    else {
      uVar59 = 0;
    }
    htmlEntityLookup(uVar59);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      uVar44 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar51 = puVar51 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar49 = &DAT_0014c1f8;
  uVar62 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      uVar44 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00158164;
  uVar62 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    htmlHandleOmittedElem(*puVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      uVar44 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar20 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar21 = xmlMemBlocks();
  if (iVar20 != iVar21) {
    iVar22 = xmlMemBlocks();
    uVar44 = (ulong)(uint)(iVar22 - iVar20);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar57 = 0;
  iVar22 = 0;
  do {
    iVar24 = (int)uVar44;
    iVar23 = xmlMemBlocks();
    pxVar40 = gen_htmlDocPtr(iVar22,iVar24);
    uVar44 = 0;
    htmlIsAutoClosed(pxVar40);
    call_tests = call_tests + 1;
    if (((pxVar40 != (htmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
      xmlFreeDoc(pxVar40);
    }
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar24 - iVar23));
      iVar57 = iVar57 + 1;
      printf(" %d");
      uVar44 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 3);
  function_tests = function_tests + 1;
  puVar51 = &DAT_0015ad60;
  uVar62 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar59 = *puVar51;
    }
    else {
      uVar59 = 0;
    }
    htmlIsScriptAttribute(uVar59);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar51 = puVar51 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  lVar41 = htmlNewParserCtxt();
  if (lVar41 != 0) {
    htmlFreeParserCtxt(lVar41);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar23 != iVar24) {
    iVar25 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar25 - iVar23));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar25 = 0;
  do {
    iVar26 = xmlMemBlocks();
    piVar60 = &call_tests;
    if (uVar62 != 0) {
      if (uVar62 == 1) {
        piVar60 = (int *)0xffffffffffffffff;
      }
      else {
        piVar60 = (int *)0x0;
      }
    }
    lVar41 = htmlNewSAXParserCtxt(0,piVar60);
    if (lVar41 != 0) {
      htmlFreeParserCtxt();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  puVar61 = &DAT_00158164;
  uVar62 = 0;
  iVar26 = 0;
  do {
    iVar27 = xmlMemBlocks();
    pcVar58 = (char *)(ulong)*puVar61;
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar28 - iVar27));
      iVar26 = iVar26 + 1;
      printf(" %d",0);
      pcVar58 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar61 = puVar61 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar27 = 0;
  do {
    iVar28 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(uVar62,(int)pcVar58);
    htmlParseCharRef(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      pcVar58 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar28 = 0;
  uVar62 = 0;
  do {
    iVar29 = 0;
    do {
      uVar56 = 0;
      do {
        puVar49 = &DAT_00158164;
        uVar53 = 0;
        do {
          iVar32 = (int)pcVar58;
          iVar30 = xmlMemBlocks();
          pxVar42 = gen_htmlParserCtxtPtr(uVar62,iVar32);
          if (iVar29 == 0) {
            bVar1 = false;
            pcVar58 = "foo";
          }
          else if (iVar29 == 2) {
            bVar1 = false;
            pcVar58 = "test/ent2";
          }
          else if (iVar29 == 1) {
            bVar1 = false;
            pcVar58 = "<foo/>";
          }
          else {
            bVar1 = true;
            pcVar58 = (char *)0x0;
          }
          iVar32 = -1;
          if ((uint)uVar56 < 4) {
            iVar32 = (&DAT_00158164)[uVar56];
          }
          uVar63 = *puVar49;
          if ((!bVar1) && (iVar31 = xmlStrlen(pcVar58), iVar31 < iVar32)) {
            iVar32 = 0;
          }
          htmlParseChunk(pxVar42,pcVar58,iVar32,uVar63);
          if (pxVar42 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar42->myDoc);
            pxVar42->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt(pxVar42);
          }
          xmlResetLastError();
          iVar32 = xmlMemBlocks();
          if (iVar30 != iVar32) {
            iVar32 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar32 - iVar30));
            iVar28 = iVar28 + 1;
            printf(" %d",(ulong)uVar62);
            printf(" %d",iVar29);
            printf(" %d",uVar56);
            pcVar58 = (char *)(ulong)uVar53;
            printf(" %d");
            putchar(10);
          }
          uVar53 = uVar53 + 1;
          puVar49 = puVar49 + 1;
        } while (uVar53 != 4);
        uVar53 = (uint)uVar56 + 1;
        uVar56 = (ulong)uVar53;
      } while (uVar53 != 4);
      iVar29 = iVar29 + 1;
    } while (iVar29 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar62 = 0;
  do {
    puVar50 = &DAT_0015ad48;
    uVar53 = 0;
    do {
      iVar30 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar59 = (&DAT_0015ad60)[uVar62];
      }
      else {
        uVar59 = 0;
      }
      if (uVar53 < 3) {
        uVar56 = *puVar50;
      }
      else {
        uVar56 = 0;
      }
      pxVar43 = (xmlDocPtr)htmlParseDoc(uVar59);
      if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar32 = xmlMemBlocks();
      if (iVar30 != iVar32) {
        iVar32 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar32 - iVar30));
        iVar29 = iVar29 + 1;
        printf(" %d",(ulong)uVar62);
        uVar56 = (ulong)uVar53;
        printf(" %d");
        putchar(10);
      }
      uVar53 = uVar53 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar30 = 0;
  do {
    iVar32 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(uVar62,(int)uVar56);
    htmlParseDocument(pxVar42);
    if (pxVar42 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar42->myDoc);
      pxVar42->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar31 = xmlMemBlocks();
    if (iVar32 != iVar31) {
      iVar31 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar31 - iVar32));
      iVar30 = iVar30 + 1;
      uVar56 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar32 = 0;
  do {
    iVar31 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(uVar62,(int)uVar56);
    htmlParseElement(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar33 = xmlMemBlocks();
    if (iVar31 != iVar33) {
      iVar33 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar33 - iVar31));
      iVar32 = iVar32 + 1;
      uVar56 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar33 = 0;
  iVar31 = 0;
  do {
    iVar35 = (int)uVar56;
    iVar34 = xmlMemBlocks();
    pxVar42 = gen_htmlParserCtxtPtr(iVar31,iVar35);
    uVar56 = 0;
    htmlParseEntityRef(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar42);
    }
    xmlResetLastError();
    iVar35 = xmlMemBlocks();
    if (iVar34 != iVar35) {
      iVar35 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar35 - iVar34));
      iVar33 = iVar33 + 1;
      printf(" %d");
      uVar56 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar31 = iVar31 + 1;
  } while (iVar31 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  do {
    puVar51 = &DAT_0015ad48;
    uVar53 = 0;
    do {
      if (uVar62 < 7) {
        uVar59 = (&DAT_0015ad80)[uVar62];
      }
      else {
        uVar59 = 0;
      }
      if (uVar53 < 3) {
        uVar46 = *puVar51;
      }
      else {
        uVar46 = 0;
      }
      pxVar43 = (xmlDocPtr)htmlParseFile(uVar59,uVar46);
      if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar53 = uVar53 + 1;
      puVar51 = puVar51 + 1;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 8);
  function_tests = function_tests + 1;
  iVar31 = 0;
  uVar62 = 0;
  do {
    uVar56 = 0;
    do {
      uVar53 = 0;
      do {
        puVar49 = &DAT_00158164;
        iVar34 = 0;
        do {
          iVar35 = xmlMemBlocks();
          if (uVar62 < 4) {
            uVar59 = (&DAT_0015ad60)[uVar62];
          }
          else {
            uVar59 = 0;
          }
          if ((uint)uVar56 < 3) {
            uVar46 = (&DAT_0015ad48)[uVar56];
          }
          else {
            uVar46 = 0;
          }
          if (uVar53 < 3) {
            uVar47 = (&DAT_0015ad48)[uVar53];
          }
          else {
            uVar47 = 0;
          }
          pxVar43 = (xmlDocPtr)htmlReadDoc(uVar59,uVar46,uVar47,*puVar49);
          if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar36 = xmlMemBlocks();
          if (iVar35 != iVar36) {
            iVar36 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar36 - iVar35));
            iVar31 = iVar31 + 1;
            printf(" %d",(ulong)uVar62);
            printf(" %d",uVar56);
            printf(" %d",(ulong)uVar53);
            printf(" %d");
            putchar(10);
          }
          iVar34 = iVar34 + 1;
          puVar49 = puVar49 + 1;
        } while (iVar34 != 4);
        uVar53 = uVar53 + 1;
      } while (uVar53 != 4);
      uVar53 = (uint)uVar56 + 1;
      uVar56 = (ulong)uVar53;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar34 = 0;
  uVar62 = 0;
  do {
    uVar56 = 0;
    do {
      iVar35 = 0;
      puVar49 = &DAT_00158164;
      do {
        iVar36 = xmlMemBlocks();
        if (uVar62 < 7) {
          uVar59 = (&DAT_0015ad80)[uVar62];
        }
        else {
          uVar59 = 0;
        }
        if ((uint)uVar56 < 3) {
          uVar46 = (&DAT_0015ad48)[uVar56];
        }
        else {
          uVar46 = 0;
        }
        pxVar43 = (xmlDocPtr)htmlReadFile(uVar59,uVar46,*puVar49);
        if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar37 = xmlMemBlocks();
        if (iVar36 != iVar37) {
          iVar37 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar37 - iVar36));
          iVar34 = iVar34 + 1;
          printf(" %d",(ulong)uVar62);
          printf(" %d",uVar56);
          printf(" %d");
          putchar(10);
        }
        iVar35 = iVar35 + 1;
        puVar49 = puVar49 + 1;
      } while (iVar35 != 4);
      uVar53 = (uint)uVar56 + 1;
      uVar56 = (ulong)uVar53;
    } while (uVar53 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 8);
  function_tests = function_tests + 1;
  local_64 = 0;
  iVar35 = 0;
  do {
    uVar62 = 0;
    do {
      uVar53 = 0;
      do {
        uVar56 = 0;
        do {
          uVar52 = 0;
          puVar49 = &DAT_00158164;
          do {
            iVar36 = xmlMemBlocks();
            if (iVar35 == 0) {
              pcVar58 = "foo";
LAB_001194d2:
              bVar1 = false;
            }
            else {
              if (iVar35 == 2) {
                pcVar58 = "test/ent2";
                goto LAB_001194d2;
              }
              if (iVar35 == 1) {
                bVar1 = false;
                pcVar58 = "<foo/>";
              }
              else {
                bVar1 = true;
                pcVar58 = (char *)0x0;
              }
            }
            iVar37 = -1;
            if (uVar62 < 4) {
              iVar37 = (&DAT_00158164)[uVar62];
            }
            if (uVar53 < 3) {
              uVar59 = (&DAT_0015ad48)[uVar53];
            }
            else {
              uVar59 = 0;
            }
            if ((uint)uVar56 < 3) {
              uVar46 = (&DAT_0015ad48)[uVar56];
            }
            else {
              uVar46 = 0;
            }
            uVar63 = *puVar49;
            if ((!bVar1) && (iVar38 = xmlStrlen(pcVar58,uVar56,uVar59), iVar38 < iVar37)) {
              iVar37 = 0;
            }
            pxVar43 = (xmlDocPtr)htmlReadMemory(pcVar58,iVar37,uVar59,uVar46,uVar63);
            if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar37 = xmlMemBlocks();
            if (iVar36 != iVar37) {
              iVar37 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar37 - iVar36));
              local_64 = local_64 + 1;
              printf(" %d",iVar35);
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar53);
              printf(" %d",uVar56);
              printf(" %d",uVar52);
              putchar(10);
            }
            uVar48 = (int)uVar52 + 1;
            uVar52 = (ulong)uVar48;
            puVar49 = puVar49 + 1;
          } while (uVar48 != 4);
          uVar48 = (uint)uVar56 + 1;
          uVar56 = (ulong)uVar48;
        } while (uVar48 != 4);
        uVar53 = uVar53 + 1;
      } while (uVar53 != 4);
      uVar62 = uVar62 + 1;
    } while (uVar62 != 4);
    iVar35 = iVar35 + 1;
    if (iVar35 == 4) {
      function_tests = function_tests + 1;
      iVar35 = 0;
      uVar62 = 0;
      do {
        uVar53 = 0;
        do {
          iVar36 = 0;
          do {
            iVar37 = xmlMemBlocks();
            if (uVar62 < 4) {
              uVar59 = (&DAT_0015ad60)[uVar62];
            }
            else {
              uVar59 = 0;
            }
            if (uVar53 < 3) {
              uVar46 = (&DAT_0015ad48)[uVar53];
            }
            else {
              uVar46 = 0;
            }
            piVar60 = &call_tests;
            if (iVar36 != 0) {
              if (iVar36 == 1) {
                piVar60 = (int *)0xffffffffffffffff;
              }
              else {
                piVar60 = (int *)0x0;
              }
            }
            pxVar43 = (xmlDocPtr)htmlSAXParseDoc(uVar59,uVar46,0,piVar60);
            if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar38 = xmlMemBlocks();
            if (iVar37 != iVar38) {
              iVar38 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar38 - iVar37));
              iVar35 = iVar35 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar53);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
            }
            iVar36 = iVar36 + 1;
          } while (iVar36 != 3);
          uVar53 = uVar53 + 1;
        } while (uVar53 != 4);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 5);
      function_tests = function_tests + 1;
      iVar36 = 0;
      uVar62 = 0;
      do {
        uVar53 = 0;
        do {
          iVar37 = 0;
          do {
            iVar38 = xmlMemBlocks();
            if (uVar62 < 7) {
              uVar59 = (&DAT_0015ad80)[uVar62];
            }
            else {
              uVar59 = 0;
            }
            if (uVar53 < 3) {
              uVar46 = (&DAT_0015ad48)[uVar53];
            }
            else {
              uVar46 = 0;
            }
            piVar60 = &call_tests;
            if (iVar37 != 0) {
              if (iVar37 == 1) {
                piVar60 = (int *)0xffffffffffffffff;
              }
              else {
                piVar60 = (int *)0x0;
              }
            }
            pxVar43 = (xmlDocPtr)htmlSAXParseFile(uVar59,uVar46,0,piVar60);
            if (((pxVar43 != (xmlDocPtr)0x0) && (api_doc != pxVar43)) && (pxVar43->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar39 = xmlMemBlocks();
            if (iVar38 != iVar39) {
              iVar39 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar39 - iVar38));
              iVar36 = iVar36 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar53);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
            }
            iVar37 = iVar37 + 1;
          } while (iVar37 != 3);
          uVar53 = uVar53 + 1;
        } while (uVar53 != 4);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 8);
      function_tests = function_tests + 1;
      iVar37 = 0;
      local_78 = 0;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        uVar59 = 0;
        if (bVar3) {
          uVar59 = 0x15d404;
        }
        uVar62 = 0;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          iVar38 = xmlMemBlocks();
          uVar46 = 0;
          if (bVar2) {
            uVar46 = 0x15d40c;
          }
          htmlUTF8ToHtml(0,uVar59,0,uVar46);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar39 = xmlMemBlocks();
          if (iVar38 != iVar39) {
            iVar39 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlUTF8ToHtml",(ulong)(uint)(iVar39 - iVar38));
            iVar37 = iVar37 + 1;
            printf(" %d",0);
            printf(" %d",local_78);
            printf(" %d",0);
            printf(" %d",(ulong)uVar62);
            putchar(10);
          }
          uVar62 = 1;
          bVar1 = false;
        } while (bVar2);
        local_78 = 1;
        bVar1 = false;
      } while (bVar3);
      function_tests = function_tests + 1;
      uVar62 = iVar6 + iVar8 + iVar7 + iVar4 + iVar5 + iVar9 + local_44 + iVar10 + iVar12 + iVar11 +
               iVar13 + (uint)(iVar14 != iVar15) + iVar16 + iVar17 + iVar18 + iVar19 +
               (uint)(iVar20 != iVar21) + iVar57 + iVar22 + (uint)(iVar23 != iVar24) + iVar25 +
               iVar26 + iVar27 + iVar28 + iVar29 + iVar30 + iVar32 + iVar33 + iVar31 + iVar34 +
               local_64 + iVar35 + iVar36 + iVar37;
      if (uVar62 != 0) {
        printf("Module HTMLparser: %d errors\n",(ulong)uVar62);
      }
      return uVar62;
    }
  } while( true );
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();
    test_ret += test_htmlUTF8ToHtml();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}